

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::parseSlots(Moc *this,ClassDef *def,Access access)

{
  qsizetype *pqVar1;
  Token TVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  QTypeRevision QVar6;
  uint uVar7;
  byte bVar8;
  long lVar9;
  long in_FS_OFFSET;
  FunctionDef funcDef;
  FunctionDef local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->super_Parser).index;
  bVar8 = 0xff;
  if (lVar3 < (this->super_Parser).symbols.d.size) {
    uVar7 = 0xff;
    if ((this->super_Parser).symbols.d.ptr[lVar3].token == Q_REVISION_TOKEN) {
      (this->super_Parser).index = lVar3 + 1;
      QVar6 = parseRevision(this);
      uVar7 = (uint)(ushort)QVar6;
      bVar8 = QVar6.m_majorVersion;
    }
  }
  else {
    uVar7 = 0xff;
  }
  lVar3 = (this->super_Parser).index;
  if (((this->super_Parser).symbols.d.size <= lVar3) ||
     ((this->super_Parser).symbols.d.ptr[lVar3].token != COLON)) {
    Parser::error(&this->super_Parser,(char *)0x0);
  }
  lVar9 = lVar3 + 1;
  (this->super_Parser).index = lVar9;
  if ((def->super_BaseDef).begin <= lVar3) {
    do {
      if (((def->super_BaseDef).end + -1 <= lVar9) || ((this->super_Parser).symbols.d.size <= lVar9)
         ) break;
      (this->super_Parser).index = lVar9 + 1;
      TVar2 = (this->super_Parser).symbols.d.ptr[lVar9].token;
      if ((int)TVar2 < 0x22) {
        if (TVar2 != SEMIC) goto LAB_0011c2f5;
      }
      else {
        if ((int)TVar2 < 0x29) {
          if (TVar2 == FRIEND) {
            until(this,SEMIC);
            goto LAB_0011c400;
          }
        }
        else {
          if ((TVar2 - PRIVATE < 3) || (TVar2 - Q_SIGNALS_TOKEN < 2)) {
            pqVar1 = &(this->super_Parser).index;
            *pqVar1 = *pqVar1 + -1;
            break;
          }
          if (TVar2 == USING) {
            Parser::error(&this->super_Parser,
                          "\'using\' directive not supported in \'slots\' section");
          }
        }
LAB_0011c2f5:
        pqVar1 = &(this->super_Parser).index;
        *pqVar1 = *pqVar1 + -1;
        memset(&local_108,0xaa,0xd0);
        local_108.type.name.d.d = (Data *)0x0;
        local_108.type.name.d.ptr = (char *)0x0;
        local_108.type.name.d.size = 0;
        local_108.type.rawName.d.d = (Data *)0x0;
        local_108.type.rawName.d.ptr = (char *)0x0;
        local_108.type.rawName.d.size = 0;
        local_108.type._48_1_ = local_108.type._48_1_ & 0xfc;
        memset(&local_108.type.typeTag,0,0x9c);
        local_108.access = access;
        bVar5 = parseFunction(this,&local_108,false);
        if (bVar5) {
          uVar4 = local_108.revision;
          if ((0 < local_108.revision) ||
             (uVar4 = uVar7 & 0xff | (uint)bVar8 << 8, (bVar8 & (byte)uVar7) != 0xff)) {
            local_108.revision = uVar4;
            def->revisionedMethods = def->revisionedMethods + 1;
          }
          while( true ) {
            QtPrivate::QMovableArrayOps<FunctionDef>::emplace<FunctionDef_const&>
                      ((QMovableArrayOps<FunctionDef> *)&def->slotList,(def->slotList).d.size,
                       &local_108);
            QList<FunctionDef>::end(&def->slotList);
            if ((local_108.arguments.d.size == 0) ||
               (local_108.arguments.d.ptr[local_108.arguments.d.size + -1].isDefault != true))
            break;
            local_108.wasCloned = true;
            if ((local_108.arguments.d.d == (Data *)0x0) ||
               (1 < ((local_108.arguments.d.d)->super_QArrayData).ref_._q_value.
                    super___atomic_base<int>._M_i)) {
              QArrayDataPointer<ArgumentDef>::reallocateAndGrow
                        (&local_108.arguments.d,GrowsAtEnd,0,(QArrayDataPointer<ArgumentDef> *)0x0);
            }
            ArgumentDef::~ArgumentDef(local_108.arguments.d.ptr + local_108.arguments.d.size + -1);
            local_108.arguments.d.size = local_108.arguments.d.size + -1;
          }
        }
        FunctionDef::~FunctionDef(&local_108);
      }
LAB_0011c400:
      lVar9 = (this->super_Parser).index;
    } while ((def->super_BaseDef).begin < lVar9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Moc::parseSlots(ClassDef *def, FunctionDef::Access access)
{
    QTypeRevision defaultRevision;
    if (test(Q_REVISION_TOKEN))
        defaultRevision = parseRevision();

    next(COLON);
    while (inClass(def) && hasNext()) {
        switch (next()) {
        case PUBLIC:
        case PROTECTED:
        case PRIVATE:
        case Q_SIGNALS_TOKEN:
        case Q_SLOTS_TOKEN:
            prev();
            return;
        case SEMIC:
            continue;
        case FRIEND:
            until(SEMIC);
            continue;
        case USING:
            error("'using' directive not supported in 'slots' section");
        default:
            prev();
        }

        FunctionDef funcDef;
        funcDef.access = access;
        if (!parseFunction(&funcDef))
            continue;
        if (funcDef.revision > 0) {
            ++def->revisionedMethods;
        } else if (defaultRevision.isValid()) {
            funcDef.revision = defaultRevision.toEncodedVersion<int>();
            ++def->revisionedMethods;
        }
        def->slotList += funcDef;
        handleDefaultArguments(&def->slotList, funcDef);
    }
}